

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O2

int Cba_NtkCiFonNum(Cba_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int i;
  
  iVar2 = (p->vInputs).nSize;
  for (i = 0; i < (p->vSeq).nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(&p->vSeq,i);
    iVar1 = Cba_ObjFonNum(p,iVar1);
    iVar2 = iVar2 + iVar1;
  }
  return iVar2;
}

Assistant:

int Cba_NtkCiFonNum( Cba_Ntk_t * p )
{
    int i, iObj, Count = Cba_NtkPiNum(p);
    Cba_NtkForEachBoxSeq( p, iObj, i )
        Count += Cba_ObjFonNum(p, iObj);
    return Count;  
}